

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  clock_t cVar1;
  clock_t cVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Signal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_> sig_increment;
  ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_> local_50;
  code *local_48 [2];
  code *local_38;
  code *pcStack_30;
  
  printf("Signal/Basic Tests: ");
  BasicSignalTests::run();
  puts("OK");
  printf("Signal/CollectorVector: ");
  TestCollectorVector::run();
  puts("OK");
  printf("Signal/CollectorUntil0: ");
  TestCollectorUntil0::run();
  puts("OK");
  printf("Signal/CollectorWhile0: ");
  TestCollectorWhile0::run();
  puts("OK");
  printf("Signal/Benchmark: Simple::Signal: ");
  local_38 = (_Manager_type)0x0;
  pcStack_30 = (_Invoker_type)0x0;
  local_48[0] = (code *)0x0;
  local_48[1] = (code *)0x0;
  Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
  ProtoSignal(&local_50,(CbFunction *)local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)((_Any_data *)local_48,(_Any_data *)local_48,__destroy_functor);
  }
  local_48[1] = (code *)0x0;
  local_48[0] = TestCounter::add2;
  pcStack_30 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>
               ::_M_invoke;
  local_38 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
             _M_manager;
  Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
  ensure_ring(&local_50);
  Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
  SignalLink::add_before(local_50.callback_ring_,(CbFunction *)local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)((_Any_data *)local_48,(_Any_data *)local_48,__destroy_functor);
  }
  lVar5 = (anonymous_namespace)::test_counter_var;
  lVar6 = 999999;
  cVar1 = clock();
  do {
    Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
    emit(&local_50,(void *)0x0,1);
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  cVar2 = clock();
  if ((anonymous_namespace)::test_counter_var - lVar5 == 999999) {
    uVar3 = (ulong)((double)cVar2 * 1000.0);
    uVar4 = (ulong)((double)cVar1 * 1000.0);
    lVar5 = ((long)((double)cVar2 * 1000.0 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3) -
            ((long)((double)cVar1 * 1000.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    printf("OK\n  Benchmark: Simple::Signal: %fns per emission (size=%u): ",
           SUB84(((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 999999.0,0),8);
    Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
    ~ProtoSignal(&local_50);
    puts("OK");
    printf("Signal/Benchmark: callback loop: ");
    lVar5 = (anonymous_namespace)::test_counter_var;
    lVar6 = 999999;
    cVar1 = clock();
    do {
      TestCounter::add2((void *)0x0,1);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    cVar2 = clock();
    if ((anonymous_namespace)::test_counter_var - lVar5 == 999999) {
      uVar3 = (ulong)((double)cVar2 * 1000.0);
      uVar4 = (ulong)((double)cVar1 * 1000.0);
      lVar5 = ((long)((double)cVar2 * 1000.0 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3)
              - ((long)((double)cVar1 * 1000.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f |
                uVar4);
      auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = 0x45300000;
      printf("OK\n  Benchmark: callback loop: %fns per round: ",
             SUB84(((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 999999.0,0));
      puts("OK");
      return 0;
    }
    __assert_fail("end_counter - start_counter == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0xd2,"void bench_callback_loop()");
  }
  __assert_fail("end_counter - start_counter == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                ,0xbf,"void bench_simple_signal()");
}

Assistant:

int
main (int   argc,
      char *argv[])
{
  printf ("Signal/Basic Tests: ");
  BasicSignalTests::run();
  printf ("OK\n");

  printf ("Signal/CollectorVector: ");
  TestCollectorVector::run();
  printf ("OK\n");

  printf ("Signal/CollectorUntil0: ");
  TestCollectorUntil0::run();
  printf ("OK\n");

  printf ("Signal/CollectorWhile0: ");
  TestCollectorWhile0::run();
  printf ("OK\n");

  printf ("Signal/Benchmark: Simple::Signal: ");
  bench_simple_signal();
  printf ("OK\n");

  printf ("Signal/Benchmark: callback loop: ");
  bench_callback_loop();
  printf ("OK\n");

  return 0;
}